

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O0

bool __thiscall bssl::ParseOCSPResponseData(bssl *this,Input raw_tlv,OCSPResponseData *out)

{
  Input input;
  Input input_00;
  bool bVar1;
  ResponderID *out_00;
  Input raw_tlv_00;
  undefined1 local_f0 [8];
  Input single_response;
  Parser responses_parser;
  undefined1 local_b8 [8];
  Input responder_input;
  undefined1 local_98 [8];
  Parser version_parser;
  undefined1 auStack_78 [7];
  bool version_present;
  Input version_input;
  Parser parser;
  undefined1 local_40 [8];
  Parser outer_parser;
  OCSPResponseData *out_local;
  Input raw_tlv_local;
  
  outer_parser.advance_len_ = raw_tlv.data_.size_;
  input_00.data_.size_ = (size_t)raw_tlv.data_.data_;
  input_00.data_.data_ = (uchar *)this;
  der::Parser::Parser((Parser *)local_40,input_00);
  der::Parser::Parser((Parser *)&version_input.data_.size_);
  bVar1 = der::Parser::ReadSequence((Parser *)local_40,(Parser *)&version_input.data_.size_);
  if (bVar1) {
    bVar1 = der::Parser::HasMore((Parser *)local_40);
    if (bVar1) {
      raw_tlv_local.data_.size_._7_1_ = false;
    }
    else {
      der::Input::Input((Input *)auStack_78);
      out_00 = (ResponderID *)((long)&version_parser.advance_len_ + 7);
      bVar1 = der::Parser::ReadOptionalTag
                        ((Parser *)&version_input.data_.size_,0xa0000000,(Input *)auStack_78,
                         (bool *)out_00);
      if (bVar1) {
        if ((version_parser.advance_len_._7_1_ & 1) == 0) {
          *(undefined1 *)outer_parser.advance_len_ = 0;
        }
        else {
          responder_input.data_.size_ = (size_t)_auStack_78;
          input.data_.size_ = (size_t)version_input.data_.data_;
          input.data_.data_ = _auStack_78;
          der::Parser::Parser((Parser *)local_98,input);
          bVar1 = der::Parser::ReadUint8((Parser *)local_98,(uint8_t *)outer_parser.advance_len_);
          if (!bVar1) {
            return false;
          }
          bVar1 = der::Parser::HasMore((Parser *)local_98);
          if (bVar1) {
            return false;
          }
        }
        if (*(char *)outer_parser.advance_len_ == '\0') {
          der::Input::Input((Input *)local_b8);
          bVar1 = der::Parser::ReadRawTLV((Parser *)&version_input.data_.size_,(Input *)local_b8);
          if (bVar1) {
            raw_tlv_00.data_.size_ = outer_parser.advance_len_ + 8;
            raw_tlv_00.data_.data_ = responder_input.data_.data_;
            bVar1 = anon_unknown_18::ParseResponderID((anon_unknown_18 *)local_b8,raw_tlv_00,out_00)
            ;
            if (bVar1) {
              bVar1 = der::Parser::ReadGeneralizedTime
                                ((Parser *)&version_input.data_.size_,
                                 (GeneralizedTime *)(outer_parser.advance_len_ + 0x30));
              if (bVar1) {
                der::Parser::Parser((Parser *)&single_response.data_.size_);
                bVar1 = der::Parser::ReadSequence
                                  ((Parser *)&version_input.data_.size_,
                                   (Parser *)&single_response.data_.size_);
                if (bVar1) {
                  ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::clear
                            ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                             (outer_parser.advance_len_ + 0x38));
                  while (bVar1 = der::Parser::HasMore((Parser *)&single_response.data_.size_), bVar1
                        ) {
                    der::Input::Input((Input *)local_f0);
                    bVar1 = der::Parser::ReadRawTLV
                                      ((Parser *)&single_response.data_.size_,(Input *)local_f0);
                    if (!bVar1) {
                      return false;
                    }
                    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
                              ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                               (outer_parser.advance_len_ + 0x38),(value_type *)local_f0);
                  }
                  bVar1 = der::Parser::ReadOptionalTag
                                    ((Parser *)&version_input.data_.size_,0xa0000001,
                                     (Input *)(outer_parser.advance_len_ + 0x58),
                                     (bool *)(outer_parser.advance_len_ + 0x50));
                  if (bVar1) {
                    bVar1 = der::Parser::HasMore((Parser *)&version_input.data_.size_);
                    raw_tlv_local.data_.size_._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
                  }
                  else {
                    raw_tlv_local.data_.size_._7_1_ = false;
                  }
                }
                else {
                  raw_tlv_local.data_.size_._7_1_ = false;
                }
              }
              else {
                raw_tlv_local.data_.size_._7_1_ = false;
              }
            }
            else {
              raw_tlv_local.data_.size_._7_1_ = false;
            }
          }
          else {
            raw_tlv_local.data_.size_._7_1_ = false;
          }
        }
        else {
          raw_tlv_local.data_.size_._7_1_ = false;
        }
      }
      else {
        raw_tlv_local.data_.size_._7_1_ = false;
      }
    }
  }
  else {
    raw_tlv_local.data_.size_._7_1_ = false;
  }
  return raw_tlv_local.data_.size_._7_1_;
}

Assistant:

bool ParseOCSPResponseData(der::Input raw_tlv, OCSPResponseData *out) {
  der::Parser outer_parser(raw_tlv);
  der::Parser parser;
  if (!outer_parser.ReadSequence(&parser)) {
    return false;
  }
  if (outer_parser.HasMore()) {
    return false;
  }

  der::Input version_input;
  bool version_present;
  if (!parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0, &version_input,
          &version_present)) {
    return false;
  }

  // For compatibilty, we ignore the restriction from X.690 Section 11.5 that
  // DEFAULT values should be omitted for values equal to the default value.
  // TODO: Add warning about non-strict parsing.
  if (version_present) {
    der::Parser version_parser(version_input);
    if (!version_parser.ReadUint8(&(out->version))) {
      return false;
    }
    if (version_parser.HasMore()) {
      return false;
    }
  } else {
    out->version = 0;
  }

  if (out->version != 0) {
    return false;
  }

  der::Input responder_input;
  if (!parser.ReadRawTLV(&responder_input)) {
    return false;
  }
  if (!ParseResponderID(responder_input, &(out->responder_id))) {
    return false;
  }
  if (!parser.ReadGeneralizedTime(&(out->produced_at))) {
    return false;
  }

  der::Parser responses_parser;
  if (!parser.ReadSequence(&responses_parser)) {
    return false;
  }
  out->responses.clear();
  while (responses_parser.HasMore()) {
    der::Input single_response;
    if (!responses_parser.ReadRawTLV(&single_response)) {
      return false;
    }
    out->responses.push_back(single_response);
  }

  if (!parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 1,
          &(out->extensions), &(out->has_extensions))) {
    return false;
  }

  return !parser.HasMore();
}